

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

void __thiscall cplus::lang::ByteArray::freeMemory(ByteArray *this)

{
  char *pcVar1;
  ulong local_20;
  size_t index;
  char *newBuffer;
  ByteArray *this_local;
  
  if (this->size != this->bufferSize) {
    pcVar1 = (char *)operator_new__(this->size);
    for (local_20 = 0; local_20 < this->size; local_20 = local_20 + 1) {
      pcVar1[local_20] = this->buffer[local_20];
    }
    if (this->buffer != (char *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = pcVar1;
    this->bufferSize = this->size;
  }
  return;
}

Assistant:

void ByteArray::freeMemory() {
			if (size != bufferSize) {
				auto newBuffer = new char[size];
				for (size_t index = 0; index < size; index++) {
					newBuffer[index] = buffer[index];
				}
				delete[] buffer;
				buffer = newBuffer;
				bufferSize = size;
			}
		}